

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void EncodeContextMap(MemoryManager *m,EncodeContextMapArena *arena,uint32_t *context_map,
                     size_t context_map_size,size_t num_clusters,HuffmanTree *tree,
                     size_t *storage_ix,uint8_t *storage)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *p;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined8 local_140;
  char local_138 [264];
  
  local_140 = tree;
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters == 1) {
    return;
  }
  p = duckdb_brotli::BrotliAllocate(m,context_map_size * 4);
  uVar3 = *context_map;
  for (uVar4 = 1; uVar4 < context_map_size; uVar4 = uVar4 + 1) {
    if (uVar3 < context_map[uVar4]) {
      uVar3 = context_map[uVar4];
    }
  }
  for (lVar10 = 0; (ulong)uVar3 + 1 != lVar10; lVar10 = lVar10 + 1) {
    local_138[lVar10] = (char)lVar10;
  }
  uVar4 = (ulong)(uVar3 + 1);
  sVar5 = 0;
  do {
    if (sVar5 == context_map_size) {
      sVar5 = 0;
      uVar4 = 0;
      do {
        uVar3 = (uint)uVar4;
        if (context_map_size <= sVar5) {
          uVar9 = 0x1f;
          if (uVar3 != 0) {
            for (; uVar3 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar11 = 6;
          if (uVar9 < 6) {
            uVar11 = (ulong)uVar9;
          }
          if (uVar3 == 0) {
            uVar11 = uVar4;
          }
          uVar9 = (uint)uVar11;
          uVar3 = 2 << ((byte)uVar11 & 0x1f);
          lVar10 = 0;
          uVar4 = 0;
LAB_0035d6fa:
          while( true ) {
            if (context_map_size <= uVar4) {
              memset(arena,0,0x440);
              for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
                arena->histogram[*(uint *)((long)p + lVar7 * 4) & 0x1ff] =
                     arena->histogram[*(uint *)((long)p + lVar7 * 4) & 0x1ff] + 1;
              }
              uVar12 = *storage_ix;
              uVar4 = uVar12 + 1;
              *(ulong *)(storage + (uVar12 >> 3)) =
                   (ulong)(uVar9 != 0) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
              *storage_ix = uVar4;
              if (uVar9 != 0) {
                *(ulong *)(storage + (uVar4 >> 3)) =
                     (ulong)(uVar9 - 1) << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
                *storage_ix = uVar12 + 5;
              }
              BuildAndStoreHuffmanTree
                        (arena->histogram,uVar11 + num_clusters,uVar11 + num_clusters,local_140,
                         arena->depths,arena->bits,storage_ix,storage);
              for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
                uVar3 = *(uint *)((long)p + lVar7 * 4);
                uVar13 = uVar3 & 0x1ff;
                uVar11 = (ulong)uVar13;
                uVar4 = *storage_ix;
                uVar12 = arena->depths[uVar11] + uVar4;
                *(ulong *)(storage + (uVar4 >> 3)) =
                     (ulong)arena->bits[uVar11] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
                *storage_ix = uVar12;
                if (uVar13 - 1 < uVar9) {
                  *(ulong *)(storage + (uVar12 >> 3)) =
                       (ulong)(uVar3 >> 9) << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
                  *storage_ix = uVar11 + uVar12;
                }
              }
              uVar4 = *storage_ix;
              *(ulong *)(storage + (uVar4 >> 3)) =
                   (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
              *storage_ix = uVar4 + 1;
              duckdb_brotli::BrotliFree(m,p);
              return;
            }
            iVar1 = *(int *)((long)p + uVar4 * 4);
            if (iVar1 == 0) break;
            *(uint *)((long)p + lVar10 * 4) = iVar1 + uVar9;
            uVar4 = uVar4 + 1;
LAB_0035d76f:
            lVar10 = lVar10 + 1;
          }
          uVar13 = (int)context_map_size - (int)uVar4;
          for (lVar7 = 1; uVar4 + lVar7 < context_map_size; lVar7 = lVar7 + 1) {
            if (*(int *)((long)p + lVar7 * 4 + uVar4 * 4) != 0) {
              uVar13 = (uint)lVar7;
              break;
            }
          }
          uVar4 = uVar4 + uVar13;
LAB_0035d73d:
          if (uVar13 != 0) {
            if (uVar3 <= uVar13) goto code_r0x0035d749;
            uVar2 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar2 == 0; uVar2 = uVar2 - 1) {
              }
            }
            *(uint *)((long)p + lVar10 * 4) =
                 ((-1 << ((byte)uVar2 & 0x1f)) + uVar13) * 0x200 | uVar2;
            goto LAB_0035d76f;
          }
          goto LAB_0035d6fa;
        }
        for (; (sVar6 = context_map_size, context_map_size != sVar5 &&
               (sVar6 = sVar5, *(int *)((long)p + sVar5 * 4) != 0)); sVar5 = sVar5 + 1) {
        }
        sVar5 = context_map_size;
        if (context_map_size < sVar6) {
          sVar5 = sVar6;
        }
        uVar9 = (int)sVar5 - (int)sVar6;
        for (lVar10 = 0; (sVar6 - sVar5) + lVar10 != 0; lVar10 = lVar10 + 1) {
          if (*(int *)((long)p + lVar10 * 4 + sVar6 * 4) != 0) {
            sVar5 = sVar6 + lVar10;
            uVar9 = (uint)lVar10;
            break;
          }
        }
        if (uVar3 < uVar9) {
          uVar4 = (ulong)uVar9;
        }
      } while( true );
    }
    cVar8 = (char)context_map[sVar5];
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      if (local_138[uVar11] == cVar8) goto LAB_0035d64b;
    }
    cVar8 = local_138[uVar4];
    uVar11 = uVar4;
LAB_0035d64b:
    *(int *)((long)p + sVar5 * 4) = (int)uVar11;
    while (uVar11 != 0) {
      local_138[uVar11] = local_138[uVar11 - 1];
      uVar11 = uVar11 - 1;
    }
    local_138[0] = cVar8;
    sVar5 = sVar5 + 1;
  } while( true );
code_r0x0035d749:
  *(uint *)((long)p + lVar10 * 4) = ~(-1 << ((byte)uVar11 & 0x1f)) << 9 | uVar9;
  uVar13 = (uVar13 - uVar3) + 1;
  lVar10 = lVar10 + 1;
  goto LAB_0035d73d;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             EncodeContextMapArena* arena,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t* BROTLI_RESTRICT const histogram = arena->histogram;
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t* BROTLI_RESTRICT const depths = arena->depths;
  uint16_t* BROTLI_RESTRICT const bits = arena->bits;

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(rle_symbols)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(arena->histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}